

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int spng_decode_scanline(spng_ctx *ctx,void *out,size_t len)

{
  decode_flags dVar1;
  spng_format fmt_00;
  uint width_00;
  uint16_t *gamma_lut_00;
  size_t sVar2;
  uchar *puVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  undefined4 uVar8;
  int iVar9;
  uint16_t *puVar10;
  int error;
  void *t;
  uint uStack_cc;
  uint8_t entry;
  int ret;
  uint processing_depth;
  uchar *pixel;
  size_t pixel_offset;
  size_t pixel_size;
  uint16_t gray_16;
  uint16_t a_16;
  uint16_t b_16;
  uint16_t g_16;
  uint16_t r_16;
  uint8_t gray_8;
  uint8_t a_8;
  uint8_t b_8;
  uint8_t g_8;
  uint8_t r_8;
  uint32_t k;
  uint32_t width;
  size_t scanline_width;
  int fmt;
  int pass;
  uchar *scanline;
  spng__iter iter;
  spng_plte_entry *plte;
  spng_sbit *sb;
  uchar *trns_px;
  uint16_t *gamma_lut;
  spng_ihdr *ihdr;
  spng_subimage *sub;
  spng_row_info *ri;
  decode_flags f;
  size_t len_local;
  void *out_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (out == (void *)0x0)) {
    ctx_local._4_4_ = 1;
  }
  else if (ctx->state < SPNG_STATE_EOI) {
    dVar1 = ctx->decode_flags;
    gamma_lut_00 = ctx->gamma_lut;
    iter.samples = (uchar *)&ctx->decode_plte;
    spng__iter_init((spng__iter *)&scanline,(uint)(ctx->ihdr).bit_depth,ctx->scanline);
    iVar9 = (ctx->row_info).pass;
    fmt_00 = ctx->fmt;
    sVar2 = ctx->subimage[iVar9].scanline_width;
    width_00 = ctx->subimage[iVar9].width;
    g_16._1_1_ = 0;
    g_16._0_1_ = 0;
    b_16._1_1_ = 0;
    b_16._0_1_ = 0;
    gray_16 = 0;
    pixel_size._6_2_ = 0;
    pixel_size._4_2_ = 0;
    pixel_size._2_2_ = 0;
    pixel_offset = 4;
    pixel = (uchar *)0x0;
    uStack_cc = (uint)(ctx->ihdr).bit_depth;
    ri._4_2_ = dVar1._0_2_;
    if ((ri._4_2_ >> 3 & 1) != 0) {
      uStack_cc = 8;
    }
    if (fmt_00 == SPNG_FMT_RGBA16) {
      pixel_offset = 8;
    }
    else if (fmt_00 == SPNG_FMT_RGB8) {
      pixel_offset = 3;
    }
    if (len < ctx->subimage[iVar9].out_width) {
      ctx_local._4_4_ = 0x42;
    }
    else {
      iVar9 = read_scanline(ctx);
      if (iVar9 == 0) {
        puVar3 = ctx->scanline;
        for (_r_16 = 0; _r_16 < width_00; _r_16 = _r_16 + 1) {
          puVar10 = (uint16_t *)((long)out + (long)pixel);
          pixel = pixel + pixel_offset;
          if ((ri._4_2_ >> 6 & 1) != 0) {
            if ((ri._4_2_ >> 7 & 1) == 0) {
              memcpy(out,puVar3,sVar2 - 1);
            }
            break;
          }
          if ((ri._4_2_ >> 8 & 1) != 0) {
            unpack_scanline((uchar *)out,puVar3,width_00,(uint)(ctx->ihdr).bit_depth,fmt_00);
            break;
          }
          if ((ctx->ihdr).color_type == '\x02') {
            if ((ctx->ihdr).bit_depth == '\x10') {
              gray_16 = *(uint16_t *)(puVar3 + _r_16 * 6);
              pixel_size._6_2_ = *(ushort *)(puVar3 + (ulong)(_r_16 * 6) + 2);
              pixel_size._4_2_ = *(ushort *)(puVar3 + (ulong)(_r_16 * 6) + 4);
              pixel_size._2_2_ = 0xffff;
            }
            else {
              if (fmt_00 == SPNG_FMT_RGBA8) {
                rgb8_row_to_rgba8(puVar3,(uchar *)out,width_00);
                break;
              }
              g_16._1_1_ = puVar3[_r_16 * 3];
              g_16._0_1_ = puVar3[_r_16 * 3 + 1];
              b_16._1_1_ = puVar3[_r_16 * 3 + 2];
              b_16._0_1_ = 0xff;
            }
LAB_00102b9e:
            if ((fmt_00 & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
              if (fmt_00 == SPNG_FMT_RGBA16) {
                if ((ctx->ihdr).bit_depth != '\x10') {
                  gray_16 = (uint16_t)g_16._1_1_;
                  pixel_size._6_2_ = (ushort)(byte)g_16;
                  pixel_size._4_2_ = (ushort)b_16._1_1_;
                  pixel_size._2_2_ = (ushort)(byte)b_16;
                }
                *puVar10 = gray_16;
                puVar10[1] = pixel_size._6_2_;
                puVar10[2] = pixel_size._4_2_;
                puVar10[3] = pixel_size._2_2_;
              }
            }
            else {
              if ((ctx->ihdr).bit_depth == '\x10') {
                g_16._1_1_ = (byte)(gray_16 >> 8);
                g_16._0_1_ = (byte)(pixel_size._6_2_ >> 8);
                b_16._1_1_ = (byte)(pixel_size._4_2_ >> 8);
                b_16._0_1_ = (byte)(pixel_size._2_2_ >> 8);
              }
              *(byte *)puVar10 = g_16._1_1_;
              *(byte *)((long)puVar10 + 1) = (byte)g_16;
              *(byte *)(puVar10 + 1) = b_16._1_1_;
              if (fmt_00 == SPNG_FMT_RGBA8) {
                *(byte *)((long)puVar10 + 3) = (byte)b_16;
              }
            }
          }
          else {
            if ((ctx->ihdr).color_type != '\x03') {
              if ((ctx->ihdr).color_type == '\x06') {
                if ((ctx->ihdr).bit_depth == '\x10') {
                  gray_16 = *(uint16_t *)(puVar3 + (_r_16 << 3));
                  pixel_size._6_2_ = *(ushort *)(puVar3 + (ulong)(_r_16 << 3) + 2);
                  pixel_size._4_2_ = *(ushort *)(puVar3 + (ulong)(_r_16 << 3) + 4);
                  pixel_size._2_2_ = *(ushort *)(puVar3 + (ulong)(_r_16 << 3) + 6);
                }
                else {
                  g_16._1_1_ = puVar3[_r_16 << 2];
                  g_16._0_1_ = puVar3[_r_16 * 4 + 1];
                  b_16._1_1_ = puVar3[_r_16 * 4 + 2];
                  b_16._0_1_ = puVar3[_r_16 * 4 + 3];
                }
              }
              else if ((ctx->ihdr).color_type == '\0') {
                if ((ctx->ihdr).bit_depth == '\x10') {
                  pixel_size._4_2_ = *(ushort *)(puVar3 + (_r_16 << 1));
                  pixel_size._6_2_ = pixel_size._4_2_;
                  gray_16 = pixel_size._4_2_;
                  if ((((uint)dVar1 & 1) == 0) || ((ctx->trns).gray != pixel_size._4_2_)) {
                    pixel_size._2_2_ = 0xffff;
                  }
                  else {
                    pixel_size._2_2_ = 0;
                  }
                }
                else {
                  b_16._1_1_ = get_sample((spng__iter *)&scanline);
                  g_16._0_1_ = b_16._1_1_;
                  g_16._1_1_ = b_16._1_1_;
                  if ((((uint)dVar1 & 1) == 0) || ((ctx->trns).gray != (ushort)b_16._1_1_)) {
                    b_16._0_1_ = 0xff;
                  }
                  else {
                    b_16._0_1_ = 0;
                  }
                }
              }
              else if ((ctx->ihdr).color_type == '\x04') {
                if ((ctx->ihdr).bit_depth == '\x10') {
                  pixel_size._4_2_ = *(ushort *)(puVar3 + (_r_16 << 2));
                  pixel_size._2_2_ = *(ushort *)(puVar3 + (ulong)(_r_16 << 2) + 2);
                  pixel_size._6_2_ = pixel_size._4_2_;
                  gray_16 = pixel_size._4_2_;
                }
                else {
                  b_16._1_1_ = puVar3[_r_16 << 1];
                  b_16._0_1_ = puVar3[_r_16 * 2 + 1];
                  g_16._0_1_ = b_16._1_1_;
                  g_16._1_1_ = b_16._1_1_;
                }
              }
              goto LAB_00102b9e;
            }
            if ((ctx->ihdr).bit_depth == '\b') {
              if ((fmt_00 & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) != 0) {
                expand_row((uchar *)out,puVar3,&ctx->decode_plte,width_00,fmt_00);
                break;
              }
              t._7_1_ = puVar3[_r_16];
            }
            else {
              t._7_1_ = get_sample((spng__iter *)&scanline);
            }
            if ((fmt_00 & (SPNG_FMT_RGB8|SPNG_FMT_RGBA8)) == 0) {
              gray_16 = CONCAT11(iter.samples[(ulong)t._7_1_ * 4],iter.samples[(ulong)t._7_1_ * 4]);
              pixel_size._6_2_ =
                   CONCAT11(iter.samples[(ulong)t._7_1_ * 4 + 1],
                            iter.samples[(ulong)t._7_1_ * 4 + 1]);
              pixel_size._4_2_ =
                   CONCAT11(iter.samples[(ulong)t._7_1_ * 4 + 2],
                            iter.samples[(ulong)t._7_1_ * 4 + 2]);
              pixel_size._2_2_ =
                   CONCAT11(iter.samples[(ulong)t._7_1_ * 4 + 3],
                            iter.samples[(ulong)t._7_1_ * 4 + 3]);
              *puVar10 = gray_16;
              puVar10[1] = pixel_size._6_2_;
              puVar10[2] = pixel_size._4_2_;
              puVar10[3] = pixel_size._2_2_;
            }
            else {
              *(uchar *)puVar10 = iter.samples[(ulong)t._7_1_ * 4];
              *(uchar *)((long)puVar10 + 1) = iter.samples[(ulong)t._7_1_ * 4 + 1];
              *(uchar *)(puVar10 + 1) = iter.samples[(ulong)t._7_1_ * 4 + 2];
              if (fmt_00 == SPNG_FMT_RGBA8) {
                *(uchar *)((long)puVar10 + 3) = iter.samples[(ulong)t._7_1_ * 4 + 3];
              }
            }
          }
        }
        if (((uint)dVar1 & 1) != 0) {
          trns_row((uchar *)out,puVar3,ctx->trns_px,ctx->bytes_per_pixel,&ctx->ihdr,width_00,fmt_00)
          ;
        }
        if ((ri._4_2_ >> 4 & 1) != 0) {
          scale_row((uchar *)out,width_00,fmt_00,uStack_cc,&ctx->decode_sb);
        }
        if ((ri._4_2_ >> 1 & 1) != 0) {
          gamma_correct_row((uchar *)out,width_00,fmt_00,gamma_lut_00);
        }
        puVar3 = ctx->prev_scanline;
        ctx->prev_scanline = ctx->scanline;
        ctx->scanline = puVar3;
        ctx_local._4_4_ = update_row_info(ctx);
        if (ctx_local._4_4_ == 0x4b) {
          if ((ctx->cur_chunk_bytes_left == 0) ||
             (iVar9 = discard_chunk_bytes(ctx,ctx->cur_chunk_bytes_left), iVar9 == 0)) {
            (ctx->last_idat).offset = (ctx->current_chunk).offset;
            uVar4 = (ctx->current_chunk).type[0];
            uVar5 = (ctx->current_chunk).type[1];
            uVar6 = (ctx->current_chunk).type[2];
            uVar7 = (ctx->current_chunk).type[3];
            (ctx->last_idat).length = (ctx->current_chunk).length;
            (ctx->last_idat).type[0] = uVar4;
            (ctx->last_idat).type[1] = uVar5;
            (ctx->last_idat).type[2] = uVar6;
            (ctx->last_idat).type[3] = uVar7;
            uVar8 = *(undefined4 *)&(ctx->current_chunk).field_0x14;
            (ctx->last_idat).crc = (ctx->current_chunk).crc;
            *(undefined4 *)&(ctx->last_idat).field_0x14 = uVar8;
          }
          else {
            ctx_local._4_4_ = decode_err(ctx,iVar9);
          }
        }
      }
      else {
        ctx_local._4_4_ = decode_err(ctx,iVar9);
      }
    }
  }
  else {
    ctx_local._4_4_ = 0x4b;
  }
  return ctx_local._4_4_;
}

Assistant:

int spng_decode_scanline(spng_ctx *ctx, void *out, size_t len)
{
    if(ctx == NULL || out == NULL) return 1;

    if(ctx->state >= SPNG_STATE_EOI) return SPNG_EOI;

    struct decode_flags f = ctx->decode_flags;

    struct spng_row_info *ri = &ctx->row_info;
    const struct spng_subimage *sub = ctx->subimage;

    const struct spng_ihdr *ihdr = &ctx->ihdr;
    const uint16_t *gamma_lut = ctx->gamma_lut;
    unsigned char *trns_px = ctx->trns_px;
    const struct spng_sbit *sb = &ctx->decode_sb;
    const struct spng_plte_entry *plte = ctx->decode_plte.rgba;
    struct spng__iter iter = spng__iter_init(ihdr->bit_depth, ctx->scanline);

    const unsigned char *scanline;

    const int pass = ri->pass;
    const int fmt = ctx->fmt;
    const size_t scanline_width = sub[pass].scanline_width;
    const uint32_t width = sub[pass].width;
    uint32_t k;
    uint8_t r_8, g_8, b_8, a_8, gray_8;
    uint16_t r_16, g_16, b_16, a_16, gray_16;
    r_8=0; g_8=0; b_8=0; a_8=0; gray_8=0;
    r_16=0; g_16=0; b_16=0; a_16=0; gray_16=0;
    size_t pixel_size = 4; /* SPNG_FMT_RGBA8 */
    size_t pixel_offset = 0;
    unsigned char *pixel;
    unsigned processing_depth = ihdr->bit_depth;

    if(f.indexed) processing_depth = 8;

    if(fmt == SPNG_FMT_RGBA16) pixel_size = 8;
    else if(fmt == SPNG_FMT_RGB8) pixel_size = 3;

    if(len < sub[pass].out_width) return SPNG_EBUFSIZ;

    int ret = read_scanline(ctx);

    if(ret) return decode_err(ctx, ret);

    scanline = ctx->scanline;

    for(k=0; k < width; k++)
    {
        pixel = (unsigned char*)out + pixel_offset;
        pixel_offset += pixel_size;

        if(f.same_layout)
        {
            if(f.zerocopy) break;

            memcpy(out, scanline, scanline_width - 1);
            break;
        }

        if(f.unpack)
        {
            unpack_scanline(out, scanline, width, ihdr->bit_depth, fmt);
            break;
        }

        if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 6), 2);
                memcpy(&g_16, scanline + (k * 6) + 2, 2);
                memcpy(&b_16, scanline + (k * 6) + 4, 2);

                a_16 = 65535;
            }
            else /* == 8 */
            {
                if(fmt == SPNG_FMT_RGBA8)
                {
                    rgb8_row_to_rgba8(scanline, out, width);
                    break;
                }

                r_8 = scanline[k * 3];
                g_8 = scanline[k * 3 + 1];
                b_8 = scanline[k * 3 + 2];

                a_8 = 255;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_INDEXED)
        {
            uint8_t entry = 0;

            if(ihdr->bit_depth == 8)
            {
                if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
                {
                    expand_row(out, scanline, &ctx->decode_plte, width, fmt);
                    break;
                }

                entry = scanline[k];
            }
            else /* < 8 */
            {
                entry = get_sample(&iter);
            }

            if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
            {
                pixel[0] = plte[entry].red;
                pixel[1] = plte[entry].green;
                pixel[2] = plte[entry].blue;
                if(fmt == SPNG_FMT_RGBA8) pixel[3] = plte[entry].alpha;

                continue;
            }
            else /* RGBA16 */
            {
                r_16 = plte[entry].red;
                g_16 = plte[entry].green;
                b_16 = plte[entry].blue;
                a_16 = plte[entry].alpha;

                r_16 = (r_16 << 8) | r_16;
                g_16 = (g_16 << 8) | g_16;
                b_16 = (b_16 << 8) | b_16;
                a_16 = (a_16 << 8) | a_16;

                memcpy(pixel, &r_16, 2);
                memcpy(pixel + 2, &g_16, 2);
                memcpy(pixel + 4, &b_16, 2);
                memcpy(pixel + 6, &a_16, 2);

                continue;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_TRUECOLOR_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&r_16, scanline + (k * 8), 2);
                memcpy(&g_16, scanline + (k * 8) + 2, 2);
                memcpy(&b_16, scanline + (k * 8) + 4, 2);
                memcpy(&a_16, scanline + (k * 8) + 6, 2);
            }
            else /* == 8 */
            {
                r_8 = scanline[k * 4];
                g_8 = scanline[k * 4 + 1];
                b_8 = scanline[k * 4 + 2];
                a_8 = scanline[k * 4 + 3];
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + k * 2, 2);

                if(f.apply_trns && ctx->trns.gray == gray_16) a_16 = 0;
                else a_16 = 65535;

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* <= 8 */
            {
                gray_8 = get_sample(&iter);

                if(f.apply_trns && ctx->trns.gray == gray_8) a_8 = 0;
                else a_8 = 255;

                r_8 = gray_8; g_8 = gray_8; b_8 = gray_8;
            }
        }
        else if(ihdr->color_type == SPNG_COLOR_TYPE_GRAYSCALE_ALPHA)
        {
            if(ihdr->bit_depth == 16)
            {
                memcpy(&gray_16, scanline + (k * 4), 2);
                memcpy(&a_16, scanline + (k * 4) + 2, 2);

                r_16 = gray_16;
                g_16 = gray_16;
                b_16 = gray_16;
            }
            else /* == 8 */
            {
                gray_8 = scanline[k * 2];
                a_8 = scanline[k * 2 + 1];

                r_8 = gray_8;
                g_8 = gray_8;
                b_8 = gray_8;
            }
        }


        if(fmt & (SPNG_FMT_RGBA8 | SPNG_FMT_RGB8))
        {
            if(ihdr->bit_depth == 16)
            {
                r_8 = r_16 >> 8;
                g_8 = g_16 >> 8;
                b_8 = b_16 >> 8;
                a_8 = a_16 >> 8;
            }

            pixel[0] = r_8;
            pixel[1] = g_8;
            pixel[2] = b_8;

            if(fmt == SPNG_FMT_RGBA8) pixel[3] = a_8;
        }
        else if(fmt == SPNG_FMT_RGBA16)
        {
            if(ihdr->bit_depth != 16)
            {
                r_16 = r_8;
                g_16 = g_8;
                b_16 = b_8;
                a_16 = a_8;
            }

            memcpy(pixel, &r_16, 2);
            memcpy(pixel + 2, &g_16, 2);
            memcpy(pixel + 4, &b_16, 2);
            memcpy(pixel + 6, &a_16, 2);
        }
    }/* for(k=0; k < width; k++) */

    if(f.apply_trns) trns_row(out, scanline, trns_px, ctx->bytes_per_pixel, &ctx->ihdr, width, fmt);

    if(f.do_scaling) scale_row(out, width, fmt, processing_depth, sb);

    if(f.apply_gamma) gamma_correct_row(out, width, fmt, gamma_lut);

    /* The previous scanline is always defiltered */
    void *t = ctx->prev_scanline;
    ctx->prev_scanline = ctx->scanline;
    ctx->scanline = t;

    ret = update_row_info(ctx);

    if(ret == SPNG_EOI)
    {
        if(ctx->cur_chunk_bytes_left) /* zlib stream ended before an IDAT chunk boundary */
        {/* Discard the rest of the chunk */
            int error = discard_chunk_bytes(ctx, ctx->cur_chunk_bytes_left);
            if(error) return decode_err(ctx, error);
        }

        ctx->last_idat = ctx->current_chunk;
    }

    return ret;
}